

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::variable_decl_abi_cxx11_(CompilerGLSL *this,SPIRVariable *variable)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  Types TVar4;
  CompilerError *this_00;
  Variant *pVVar5;
  SPIRType *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  spirv_cross local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  spirv_cross local_170 [36];
  uint32_t local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [4];
  uint32_t expr_1;
  spirv_cross local_128 [32];
  undefined1 local_108 [68];
  uint32_t local_c4;
  string local_c0 [4];
  uint32_t expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [34];
  char local_5e;
  char local_5d;
  allocator local_49;
  string local_48 [32];
  SPIRType *local_28;
  SPIRType *type;
  SPIRVariable *variable_local;
  CompilerGLSL *this_local;
  string *res;
  
  type = in_RDX;
  variable_local = variable;
  this_local = this;
  local_28 = Compiler::get_variable_data_type((Compiler *)variable,(SPIRVariable *)in_RDX);
  if (1 < local_28->pointer_depth) {
    local_5d = '\x01';
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_48,"Cannot declare pointer-to-pointer types.",&local_49);
    CompilerError::CompilerError(this_00,(string *)local_48);
    local_5d = '\0';
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  local_5e = '\0';
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(variable->super_IVariant)._vptr_IVariant[0x2b])(local_80,variable,(ulong)uVar3);
  pSVar1 = local_28;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(variable->super_IVariant)._vptr_IVariant[6])(local_c0,variable,(ulong)uVar3,1);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(variable->super_IVariant)._vptr_IVariant[0x1a])(local_a0,variable,pSVar1,local_c0,(ulong)uVar3)
  ;
  join<std::__cxx11::string,std::__cxx11::string>((spirv_cross *)this,local_80,local_a0);
  ::std::__cxx11::string::~string((string *)local_a0);
  ::std::__cxx11::string::~string(local_c0);
  ::std::__cxx11::string::~string((string *)local_80);
  if ((((type->member_types).stack_storage.aligned_char[8] & 1U) == 0) ||
     (uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4)),
     uVar3 == 0)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->columns);
    if (uVar3 != 0) {
      local_14c = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->columns);
      pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                         ((VectorView<spirv_cross::Variant> *)
                          &(variable->dereference_chain).super_VectorView<unsigned_int>.buffer_size,
                          (ulong)local_14c);
      TVar4 = Variant::get_type(pVVar5);
      if (TVar4 == TypeUndef) {
        if (((variable[0x28].static_expression.id & 0x10000) != 0) &&
           (bVar2 = type_can_zero_initialize((CompilerGLSL *)variable,local_28), bVar2)) {
          uVar3 = Compiler::get_variable_data_type_id((Compiler *)variable,(SPIRVariable *)type);
          (*(variable->super_IVariant)._vptr_IVariant[0x33])(local_1d0,variable,(ulong)uVar3);
          join<char_const(&)[4],std::__cxx11::string>(local_1b0,(char (*) [4])0x4f38c2,local_1d0);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_1b0);
          ::std::__cxx11::string::~string((string *)local_1b0);
          ::std::__cxx11::string::~string((string *)local_1d0);
        }
      }
      else {
        (*(variable->super_IVariant)._vptr_IVariant[0x32])(local_190,variable,type);
        join<char_const(&)[4],std::__cxx11::string>(local_170,(char (*) [4])0x4f38c2,local_190);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_170);
        ::std::__cxx11::string::~string((string *)local_170);
        ::std::__cxx11::string::~string((string *)local_190);
      }
    }
  }
  else {
    local_c4 = TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)
                          ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4));
    pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                       ((VectorView<spirv_cross::Variant> *)
                        &(variable->dereference_chain).super_VectorView<unsigned_int>.buffer_size,
                        (ulong)local_c4);
    TVar4 = Variant::get_type(pVVar5);
    if (TVar4 == TypeUndef) {
      if (((variable[0x28].static_expression.id & 0x10000) != 0) &&
         (bVar2 = type_can_zero_initialize((CompilerGLSL *)variable,local_28), bVar2)) {
        uVar3 = Compiler::get_variable_data_type_id((Compiler *)variable,(SPIRVariable *)type);
        (*(variable->super_IVariant)._vptr_IVariant[0x33])(local_148,variable,(ulong)uVar3);
        join<char_const(&)[4],std::__cxx11::string>(local_128,(char (*) [4])0x4f38c2,local_148);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_128);
        ::std::__cxx11::string::~string((string *)local_128);
        ::std::__cxx11::string::~string((string *)local_148);
      }
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4));
      to_expression_abi_cxx11_((CompilerGLSL *)local_108,(uint32_t)variable,SUB41(uVar3,0));
      join<char_const(&)[4],std::__cxx11::string>
                ((spirv_cross *)(local_108 + 0x20),(char (*) [4])0x4f38c2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_108 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_108 + 0x20));
      ::std::__cxx11::string::~string((string *)local_108);
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRVariable &variable)
{
	// Ignore the pointer type since GLSL doesn't have pointers.
	auto &type = get_variable_data_type(variable);

	if (type.pointer_depth > 1)
		SPIRV_CROSS_THROW("Cannot declare pointer-to-pointer types.");

	auto res = join(to_qualifiers_glsl(variable.self), variable_decl(type, to_name(variable.self), variable.self));

	if (variable.loop_variable && variable.static_expression)
	{
		uint32_t expr = variable.static_expression;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_expression(variable.static_expression));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}
	else if (variable.initializer)
	{
		uint32_t expr = variable.initializer;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_initializer_expression(variable));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}

	return res;
}